

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istack.c
# Opt level: O3

Node * prvTidyInsertedToken(TidyDocImpl *doc)

{
  undefined4 uVar1;
  undefined4 uVar2;
  Lexer *lexer;
  uint uVar3;
  uint uVar4;
  Node *pNVar5;
  tmbstr ptVar6;
  AttVal *pAVar7;
  IStack *pIVar8;
  
  lexer = doc->lexer;
  pNVar5 = lexer->inode;
  if (lexer->insert == (IStack *)0x0) {
    lexer->inode = (Node *)0x0;
  }
  else {
    if (pNVar5 == (Node *)0x0) {
      uVar1 = doc->docIn->curcol;
      uVar2 = doc->docIn->curline;
      lexer->lines = uVar2;
      lexer->columns = uVar1;
    }
    pNVar5 = prvTidyNewNode(doc->allocator,lexer);
    pNVar5->type = StartTag;
    pNVar5->implicit = yes;
    uVar3 = lexer->txtend;
    pNVar5->start = lexer->txtstart;
    pNVar5->end = uVar3;
    pIVar8 = lexer->insert;
    ptVar6 = prvTidytmbstrdup(doc->allocator,pIVar8->element);
    pNVar5->element = ptVar6;
    pNVar5->tag = pIVar8->tag;
    pAVar7 = prvTidyDupAttrs(doc,pIVar8->attributes);
    pNVar5->attributes = pAVar7;
    uVar4 = (int)((ulong)((long)lexer->insert - (long)lexer->istack) >> 5) + 1;
    pIVar8 = (IStack *)0x0;
    if (uVar4 < lexer->istacksize) {
      pIVar8 = lexer->istack + uVar4;
    }
    lexer->insert = pIVar8;
  }
  return pNVar5;
}

Assistant:

Node *TY_(InsertedToken)( TidyDocImpl* doc )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    IStack *istack;
    uint n;

    /* this will only be NULL if inode != NULL */
    if (lexer->insert == NULL)
    {
        node = lexer->inode;
        lexer->inode = NULL;
        return node;
    }

    /*
      If this is the "latest" node then update
      the position, otherwise use current values
    */

    if (lexer->inode == NULL)
    {
        lexer->lines = doc->docIn->curline;
        lexer->columns = doc->docIn->curcol;
    }

    node = TY_(NewNode)(doc->allocator, lexer);
    node->type = StartTag;
    node->implicit = yes;
    node->start = lexer->txtstart;
    /* #431734 [JTidy bug #226261 (was 126261)] - fix by Gary Peskin 20 Dec 00 */ 
    node->end = lexer->txtend; /* was : lexer->txtstart; */
    istack = lexer->insert;

/* #if 0 && defined(_DEBUG) */
#if definedENABLE_DEBUG_LOG
    if ( lexer->istacksize == 0 )
    {
        SPRTF( "WARNING: ZERO sized istack!\n" );
    }
#endif

    node->element = TY_(tmbstrdup)(doc->allocator, istack->element);
    node->tag = istack->tag;
    node->attributes = TY_(DupAttrs)( doc, istack->attributes );

    /* advance lexer to next item on the stack */
    n = (uint)(lexer->insert - &(lexer->istack[0]));

    /* and recover state if we have reached the end */
    if (++n < lexer->istacksize)
        lexer->insert = &(lexer->istack[n]);
    else
        lexer->insert = NULL;

    return node;
}